

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_graph.cc
# Opt level: O0

void GraphTask::add_edge_features_single_fn(task_data *D,float fv,uint64_t fx)

{
  ulong in_RSI;
  long in_RDI;
  size_t k;
  uint64_t fx2;
  features *fs;
  example *node;
  
  features::push_back(*(features **)(in_RDI + 0x90),
                      (feature_value)
                      ((ulong)&(*(features **)(in_RDI + 0x90))[0x83].indicies >> 0x20),
                      in_RSI / *(ulong *)(in_RDI + 0x28));
  return;
}

Assistant:

void add_edge_features_single_fn(task_data& D, float fv, uint64_t fx)
{
  example* node = D.cur_node;
  features& fs = node->feature_space[neighbor_namespace];
  uint64_t fx2 = fx / (uint64_t)D.multiplier;
  size_t k = (size_t)D.neighbor_predictions[0];
  fs.push_back(fv, (uint32_t)((fx2 + 348919043 * k) * D.multiplier) & (uint64_t)D.mask);
}